

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

RunningSection * __thiscall
Catch::RunningSection::findOrAddSubSection(RunningSection *this,string *name,bool *changed)

{
  bool bVar1;
  reference ppRVar2;
  RunningSection *pRVar3;
  undefined1 *in_RDX;
  RunningSection *in_RDI;
  RunningSection *subSection;
  const_iterator it;
  RunningSection *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  byte in_stack_ffffffffffffff87;
  RunningSection *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_58 [32];
  RunningSection **local_38;
  RunningSection **local_30;
  __normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
  local_28;
  undefined1 *local_20;
  
  local_20 = in_RDX;
  local_30 = (RunningSection **)
             std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>::begin
                       ((vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_> *
                        )in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<Catch::RunningSection*const*,std::vector<Catch::RunningSection*,std::allocator<Catch::RunningSection*>>>
  ::__normal_iterator<Catch::RunningSection**>
            ((__normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
              *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             (__normal_iterator<Catch::RunningSection_**,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
              *)in_stack_ffffffffffffff78);
  while( true ) {
    local_38 = (RunningSection **)
               std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>::end
                         ((vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>
                           *)in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       (__normal_iterator<Catch::RunningSection_**,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) {
      pRVar3 = (RunningSection *)operator_new(0x48);
      RunningSection(in_stack_ffffffffffffff90,in_RDI,
                     (string *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>::push_back
                ((vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_> *)
                 in_stack_ffffffffffffff90,(value_type *)in_RDI);
      in_RDI->m_state = Branch;
      *local_20 = 1;
      return pRVar3;
    }
    __gnu_cxx::
    __normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
    ::operator*(&local_28);
    getName_abi_cxx11_(in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff87 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
    ;
    std::__cxx11::string::~string(local_58);
    if ((in_stack_ffffffffffffff87 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
    ::operator++(&local_28);
  }
  ppRVar2 = __gnu_cxx::
            __normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
            ::operator*(&local_28);
  return *ppRVar2;
}

Assistant:

RunningSection* findOrAddSubSection( std::string const& name, bool& changed ) {
            for(    SubSections::const_iterator it = m_subSections.begin();
                    it != m_subSections.end();
                    ++it)
                if( (*it)->getName() == name )
                    return *it;
            RunningSection* subSection = new RunningSection( this, name );
            m_subSections.push_back( subSection );
            m_state = Branch;
            changed = true;
            return subSection;
        }